

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcursor.cpp
# Opt level: O1

int main(void)

{
  ushort uVar1;
  Am_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Value *pAVar4;
  Am_Object how_set_inter;
  Am_Object cmd;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Initialize();
  Am_Object::Create((char *)&AStack_28);
  uVar1 = Am_Object::Set((ushort)&AStack_28,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x2d);
  uVar1 = Am_Object::Set(uVar1,0x66,500);
  uVar1 = Am_Object::Set(uVar1,0x67,200);
  uVar1 = Am_Object::Set(uVar1,(char *)0x6c,0x104023);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar2);
  Am_Object::operator=(&window,pAVar3);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::Create((char *)&local_20);
  uVar1 = Am_Object::Set((ushort)&local_20,(char *)0xb9,0x104047);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,true,1);
  Am_Object::Am_Object(&AStack_28,pAVar3);
  Am_Object::~Am_Object(&local_20);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&AStack_28,0xc5);
  Am_Object::Am_Object(&local_20,pAVar4);
  Am_Object::Set((ushort)&local_20,(Am_Method_Wrapper *)0xca,(ulong)change_setting.from_wrapper);
  Am_Object::Am_Object(&local_10,&AStack_28);
  Am_Object::Add_Part((Am_Object)0x1061f0,SUB81(&local_10,0),1);
  Am_Object::~Am_Object(&local_10);
  Am_Object::Am_Object(&local_18,&window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_18,0),1);
  Am_Object::~Am_Object(&local_18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'1\' to change cursor to red/yellow happy face",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'2\' to change cursor to blue/green ds9 ship",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'3\' to change cursor to purple/orange borg ship",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'4\' to change cursor to yellow/black crosshair",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'5\' to change cursor to white/red romulan ship",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'6\' to restore cursor Am_No_Value",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type \'q\' to quit ",0x11);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::ostream::flush();
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&AStack_28);
  return 0;
}

Assistant:

int
main(void)
{

  Am_Initialize();

  window = Am_Window.Create("window")
               .Set(Am_LEFT, 20)
               .Set(Am_TOP, 45)
               .Set(Am_WIDTH, 500)
               .Set(Am_HEIGHT, 200)
               .Set(Am_TITLE, "Happy Cursor Window")
               .Set(Am_FILL_STYLE, Am_Amulet_Purple);

  Am_Object how_set_inter = Am_One_Shot_Interactor.Create("change_settings")
                                .Set(Am_START_WHEN, "ANY_KEYBOARD")
                                .Set(Am_START_WHERE_TEST, true);
  Am_Object cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  window.Add_Part(how_set_inter);

  Am_Screen.Add_Part(window);

  cout << "Type '1' to change cursor to red/yellow happy face" << endl;
  cout << "Type '2' to change cursor to blue/green ds9 ship" << endl;
  cout << "Type '3' to change cursor to purple/orange borg ship" << endl;
  cout << "Type '4' to change cursor to yellow/black crosshair" << endl;
  cout << "Type '5' to change cursor to white/red romulan ship" << endl;
  cout << "Type '6' to restore cursor Am_No_Value" << endl;
  cout << "Type 'q' to quit " << endl << flush;

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}